

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O2

void __thiscall
xLearn::LinearScore::CalcGrad(LinearScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  real_t norm_00;
  real_t norm_01;
  allocator local_6a;
  allocator local_69;
  Logger local_68;
  real_t local_64;
  string local_60;
  string local_40;
  
  psVar1 = &(this->super_Score).opt_type_;
  local_64 = norm;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 == 0) {
    calc_grad_sgd(this,row,model,pg,norm_00);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 != 0) {
      local_68.severity_ = FATAL;
      std::__cxx11::string::string
                ((string *)&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/score/linear_score.cc"
                 ,&local_69);
      std::__cxx11::string::string((string *)&local_60,"CalcGrad",&local_6a);
      poVar3 = Logger::Start(FATAL,&local_40,0x42,&local_60);
      poVar3 = std::operator<<(poVar3,"Unknow optimization method: ");
      std::operator<<(poVar3,(string *)psVar1);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      Logger::~Logger(&local_68);
      return;
    }
    calc_grad_ftrl(this,row,model,pg,local_64);
    return;
  }
  calc_grad_adagrad(this,row,model,pg,norm_01);
  return;
}

Assistant:

void LinearScore::CalcGrad(const SparseRow* row,
                           Model& model,
                           real_t pg,
                           real_t norm) {
  // Using sgd
  if (opt_type_.compare("sgd") == 0) {
    this->calc_grad_sgd(row, model, pg, norm);
  }
  // Using adagrad
  else if (opt_type_.compare("adagrad") == 0) {
    this->calc_grad_adagrad(row, model, pg, norm);
  }
  // Using ftrl
  else if (opt_type_.compare("ftrl") == 0) {
    this->calc_grad_ftrl(row, model, pg, norm);
  }
  else {
    LOG(FATAL) << "Unknow optimization method: " << opt_type_;
  }
}